

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmWin.c
# Opt level: O1

void Sfm_NtkDfs_rec(Sfm_Ntk_t *p,int iNode,Vec_Int_t *vNodes,Vec_Wec_t *vGroups,Vec_Int_t *vGroupMap
                   ,Vec_Int_t *vBoxesLeft)

{
  int iVar1;
  int *piVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  Vec_Int_t *pVVar7;
  long lVar8;
  
  if (iNode < p->nPis) {
    return;
  }
  if ((-1 < iNode) && (iNode < (p->vTravIds).nSize)) {
    piVar2 = (p->vTravIds).pArray;
    if (piVar2[(uint)iNode] == p->nTravIds) {
      return;
    }
    if (iNode < vGroupMap->nSize) {
      if (vGroupMap->pArray[(uint)iNode] < 0) {
        piVar2[(uint)iNode] = p->nTravIds;
        if (iNode < (p->vFanins).nSize) {
          lVar6 = 0;
          do {
            pVVar3 = (p->vFanins).pArray;
            pVVar7 = vNodes;
            if (pVVar3[(uint)iNode].nSize <= lVar6) goto LAB_0052e587;
            if (pVVar3[(uint)iNode].nSize <= lVar6) goto LAB_0052e597;
            Sfm_NtkDfs_rec(p,pVVar3[(uint)iNode].pArray[lVar6],vNodes,vGroups,vGroupMap,vBoxesLeft);
            lVar6 = lVar6 + 1;
          } while (iNode < (p->vFanins).nSize);
        }
      }
      else {
        iNode = (uint)vGroupMap->pArray[(uint)iNode] >> 1;
        if (iNode < vGroups->nSize) {
          pVVar3 = vGroups->pArray;
          if (0 < (long)pVVar3[(uint)iNode].nSize) {
            lVar6 = 0;
            do {
              if ((pVVar3[(uint)iNode].pArray[lVar6] < p->nPis) ||
                 (p->nObjs <= pVVar3[(uint)iNode].pArray[lVar6] + p->nPos)) {
                __assert_fail("Sfm_ObjIsNode(p, iNode)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmWin.c"
                              ,0x94,
                              "void Sfm_NtkDfs_rec(Sfm_Ntk_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *)"
                             );
              }
              lVar6 = lVar6 + 1;
            } while (pVVar3[(uint)iNode].nSize != lVar6);
          }
          if (0 < pVVar3[(uint)iNode].nSize) {
            piVar4 = pVVar3[(uint)iNode].pArray;
            lVar6 = 0;
            do {
              iVar1 = piVar4[lVar6];
              if (((long)iVar1 < 0) || ((p->vTravIds).nSize <= iVar1)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              piVar2[iVar1] = p->nTravIds;
              lVar6 = lVar6 + 1;
            } while (lVar6 < pVVar3[(uint)iNode].nSize);
          }
          if (0 < pVVar3[(uint)iNode].nSize) {
            lVar6 = 0;
            do {
              iVar1 = pVVar3[(uint)iNode].pArray[lVar6];
              lVar5 = (long)iVar1;
              if (lVar5 < 0) goto LAB_0052e561;
              lVar8 = 0;
              while( true ) {
                if ((p->vFanins).nSize <= iVar1) goto LAB_0052e561;
                pVVar7 = (p->vFanins).pArray;
                if (pVVar7[lVar5].nSize <= lVar8) break;
                if (pVVar7[lVar5].nSize <= lVar8) goto LAB_0052e597;
                Sfm_NtkDfs_rec(p,pVVar7[lVar5].pArray[lVar8],vNodes,vGroups,vGroupMap,vBoxesLeft);
                lVar8 = lVar8 + 1;
                if (iVar1 < 0) goto LAB_0052e561;
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 < pVVar3[(uint)iNode].nSize);
          }
          pVVar7 = vBoxesLeft;
          if (0 < pVVar3[(uint)iNode].nSize) {
            lVar6 = 0;
            do {
              Vec_IntPush(vNodes,pVVar3[(uint)iNode].pArray[lVar6]);
              lVar6 = lVar6 + 1;
            } while (lVar6 < pVVar3[(uint)iNode].nSize);
          }
LAB_0052e587:
          Vec_IntPush(pVVar7,iNode);
          return;
        }
      }
LAB_0052e561:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                    ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
  }
LAB_0052e597:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Sfm_NtkDfs_rec( Sfm_Ntk_t * p, int iNode, Vec_Int_t * vNodes, Vec_Wec_t * vGroups, Vec_Int_t * vGroupMap, Vec_Int_t * vBoxesLeft )
{
    int i, iFanin;
    if ( Sfm_ObjIsPi(p, iNode) )
        return;
    if ( Sfm_ObjIsTravIdCurrent(p, iNode) )
        return;
    if ( Vec_IntEntry(vGroupMap, iNode) >= 0 )
    {
        int k, iGroup = Abc_Lit2Var( Vec_IntEntry(vGroupMap, iNode) );
        Vec_Int_t * vGroup = Vec_WecEntry( vGroups, iGroup );
        Vec_IntForEachEntry( vGroup, iNode, i )
            assert( Sfm_ObjIsNode(p, iNode) );
        Vec_IntForEachEntry( vGroup, iNode, i )
            Sfm_ObjSetTravIdCurrent( p, iNode );
        Vec_IntForEachEntry( vGroup, iNode, i )
            Sfm_ObjForEachFanin( p, iNode, iFanin, k )
                Sfm_NtkDfs_rec( p, iFanin, vNodes, vGroups, vGroupMap, vBoxesLeft );
        Vec_IntForEachEntry( vGroup, iNode, i )
            Vec_IntPush( vNodes, iNode );
        Vec_IntPush( vBoxesLeft, iGroup );
    }
    else
    {
        Sfm_ObjSetTravIdCurrent(p, iNode);
        Sfm_ObjForEachFanin( p, iNode, iFanin, i )
            Sfm_NtkDfs_rec( p, iFanin, vNodes, vGroups, vGroupMap, vBoxesLeft );
        Vec_IntPush( vNodes, iNode );
    }
}